

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdsample.c
# Opt level: O3

void h2v2_fancy_upsample(j_decompress_ptr cinfo,jpeg_component_info *compptr,JSAMPARRAY input_data,
                        JSAMPARRAY *output_data_ptr)

{
  JDIMENSION JVar1;
  JSAMPARRAY ppJVar2;
  byte *pbVar3;
  byte *pbVar4;
  bool bVar5;
  bool bVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  JSAMPROW pJVar11;
  int iVar12;
  int iVar13;
  JSAMPROW pJVar14;
  
  if (0 < cinfo->max_v_samp_factor) {
    ppJVar2 = *output_data_ptr;
    lVar7 = 0;
    lVar8 = 0;
    do {
      lVar8 = (long)(int)lVar8;
      bVar6 = true;
      do {
        bVar5 = bVar6;
        pbVar3 = input_data[lVar7];
        pbVar4 = *(byte **)(((ulong)(((byte)~bVar5 & 1) << 4) - 8) + (long)(input_data + lVar7));
        pJVar11 = ppJVar2[lVar8];
        iVar12 = (uint)*pbVar4 + (uint)*pbVar3 + (uint)*pbVar3 * 2;
        iVar9 = (uint)pbVar4[1] + (uint)pbVar3[1] + (uint)pbVar3[1] * 2;
        *pJVar11 = (JSAMPLE)(iVar12 * 4 + 8U >> 4);
        pJVar11[1] = (JSAMPLE)(iVar12 * 3 + iVar9 + 7U >> 4);
        JVar1 = compptr->downsampled_width;
        pJVar14 = pJVar11 + 2;
        if (JVar1 != 2) {
          lVar10 = 2;
          iVar13 = iVar12;
          do {
            iVar12 = iVar9;
            pJVar11 = pJVar14;
            iVar9 = (uint)pbVar4[lVar10] + (uint)pbVar3[lVar10] + (uint)pbVar3[lVar10] * 2;
            *pJVar11 = (JSAMPLE)(iVar13 + iVar12 * 3 + 8U >> 4);
            pJVar11[1] = (JSAMPLE)(iVar12 * 3 + iVar9 + 7U >> 4);
            pJVar14 = pJVar11 + 2;
            lVar10 = lVar10 + 1;
            iVar13 = iVar12;
          } while (JVar1 != (JDIMENSION)lVar10);
        }
        lVar8 = lVar8 + 1;
        *pJVar14 = (JSAMPLE)(iVar9 * 3 + iVar12 + 8U >> 4);
        pJVar11[3] = (JSAMPLE)(iVar9 * 4 + 7U >> 4);
        bVar6 = false;
      } while (bVar5);
      lVar7 = lVar7 + 1;
    } while ((int)lVar8 < cinfo->max_v_samp_factor);
  }
  return;
}

Assistant:

METHODDEF(void)
h2v2_fancy_upsample(j_decompress_ptr cinfo, jpeg_component_info *compptr,
                    JSAMPARRAY input_data, JSAMPARRAY *output_data_ptr)
{
  JSAMPARRAY output_data = *output_data_ptr;
  register JSAMPROW inptr0, inptr1, outptr;
#if BITS_IN_JSAMPLE == 8
  register int thiscolsum, lastcolsum, nextcolsum;
#else
  register JLONG thiscolsum, lastcolsum, nextcolsum;
#endif
  register JDIMENSION colctr;
  int inrow, outrow, v;

  inrow = outrow = 0;
  while (outrow < cinfo->max_v_samp_factor) {
    for (v = 0; v < 2; v++) {
      /* inptr0 points to nearest input row, inptr1 points to next nearest */
      inptr0 = input_data[inrow];
      if (v == 0)               /* next nearest is row above */
        inptr1 = input_data[inrow - 1];
      else                      /* next nearest is row below */
        inptr1 = input_data[inrow + 1];
      outptr = output_data[outrow++];

      /* Special case for first column */
      thiscolsum = (*inptr0++) * 3 + (*inptr1++);
      nextcolsum = (*inptr0++) * 3 + (*inptr1++);
      *outptr++ = (JSAMPLE)((thiscolsum * 4 + 8) >> 4);
      *outptr++ = (JSAMPLE)((thiscolsum * 3 + nextcolsum + 7) >> 4);
      lastcolsum = thiscolsum;  thiscolsum = nextcolsum;

      for (colctr = compptr->downsampled_width - 2; colctr > 0; colctr--) {
        /* General case: 3/4 * nearer pixel + 1/4 * further pixel in each */
        /* dimension, thus 9/16, 3/16, 3/16, 1/16 overall */
        nextcolsum = (*inptr0++) * 3 + (*inptr1++);
        *outptr++ = (JSAMPLE)((thiscolsum * 3 + lastcolsum + 8) >> 4);
        *outptr++ = (JSAMPLE)((thiscolsum * 3 + nextcolsum + 7) >> 4);
        lastcolsum = thiscolsum;  thiscolsum = nextcolsum;
      }

      /* Special case for last column */
      *outptr++ = (JSAMPLE)((thiscolsum * 3 + lastcolsum + 8) >> 4);
      *outptr++ = (JSAMPLE)((thiscolsum * 4 + 7) >> 4);
    }
    inrow++;
  }
}